

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime_format.cpp
# Opt level: O2

char * __thiscall
duckdb::StrfTimeFormat::WriteStandardSpecifier
          (StrfTimeFormat *this,StrTimeSpecifier specifier,int32_t *data,char *tz_name,size_t tz_len
          ,char *target)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  char cVar4;
  undefined2 uVar5;
  uint32_t value;
  int iVar6;
  size_t sVar7;
  long lVar8;
  char *pcVar9;
  InternalException *this_00;
  ulong uVar10;
  undefined1 *puVar11;
  size_t padding;
  uint8_t value_00;
  short sVar12;
  int32_t year;
  undefined7 in_register_00000031;
  allocator local_39;
  string local_38;
  
  switch((int)CONCAT71(in_register_00000031,specifier)) {
  case 3:
    iVar6 = data[2];
    goto LAB_0084c456;
  case 4:
    value_00 = (uint8_t)(data[2] % 100);
    break;
  case 5:
    iVar6 = data[1];
    puVar11 = Date::MONTH_NAMES_ABBREVIATED;
    goto LAB_0084c485;
  case 6:
    iVar6 = data[1];
    puVar11 = Date::MONTH_NAMES;
LAB_0084c485:
    lVar8 = (long)iVar6 * 0x10;
    uVar10 = (ulong)*(uint *)(puVar11 + lVar8 + -0x10);
    if (uVar10 < 0xd) {
      puVar11 = puVar11 + lVar8 + -0xc;
    }
    else {
      puVar11 = *(undefined1 **)(puVar11 + lVar8 + -8);
    }
    switchD_00916250::default(target,puVar11,uVar10);
    return target + uVar10;
  case 7:
    iVar6 = data[1];
    goto LAB_0084c456;
  case 8:
    value_00 = (uint8_t)data[1];
    break;
  case 9:
    uVar1 = *data;
    uVar3 = -uVar1;
    if (0 < (int)uVar1) {
      uVar3 = uVar1;
    }
    uVar5 = *(undefined2 *)
             (duckdb_fmt::v6::internal::basic_data<void>::digits + ((ulong)uVar3 % 100) * 2);
    goto LAB_0084c463;
  case 10:
    uVar1 = *data;
    uVar3 = -uVar1;
    if (0 < (int)uVar1) {
      uVar3 = uVar1;
    }
    value_00 = (uint8_t)((ulong)uVar3 % 100);
    break;
  case 0xb:
    value = *data;
    if (9999 < value) {
      if ((int)value < 0) {
        *target = '-';
        value = -value;
        target = target + 1;
      }
      iVar6 = NumericHelper::UnsignedLength<unsigned_int>(value);
      NumericHelper::FormatUnsigned<int>(value,target + iVar6);
      return target + iVar6;
    }
    padding = 4;
    goto LAB_0084c4f3;
  case 0xc:
    iVar6 = data[3];
    goto LAB_0084c456;
  case 0xd:
    value_00 = (uint8_t)data[3];
    break;
  case 0xe:
    uVar10 = 0x18;
    if (data[3] % 0xc != 0) {
      uVar10 = (ulong)(uint)((data[3] % 0xc) * 2);
    }
    uVar5 = *(undefined2 *)(duckdb_fmt::v6::internal::basic_data<void>::digits + uVar10);
    goto LAB_0084c463;
  case 0xf:
    lVar8 = (long)data[3] % 0xc;
    if ((int)((long)data[3] % 0xc) == 0) {
      lVar8 = 0xc;
    }
    value_00 = (uint8_t)lVar8;
    break;
  case 0x10:
    cVar4 = 'A';
    if (0xb < data[3]) {
      cVar4 = 'P';
    }
    *target = cVar4;
    target[1] = 'M';
    goto LAB_0084c466;
  case 0x11:
    iVar6 = data[4];
    goto LAB_0084c456;
  case 0x12:
    value_00 = (uint8_t)data[4];
    break;
  case 0x13:
    iVar6 = data[5];
LAB_0084c456:
    uVar5 = *(undefined2 *)(duckdb_fmt::v6::internal::basic_data<void>::digits + (uint)(iVar6 * 2));
LAB_0084c463:
    *(undefined2 *)target = uVar5;
LAB_0084c466:
    return target + 2;
  case 0x14:
    value_00 = (uint8_t)data[5];
    break;
  case 0x15:
    value = data[6] / 1000;
    padding = 6;
    goto LAB_0084c4f3;
  case 0x16:
    pcVar9 = WritePadded3(this,target,data[6] / 1000000);
    return pcVar9;
  case 0x17:
    *target = (char)(data[7] >> 0x1f) * -2 + '+';
    uVar1 = data[7];
    uVar3 = -uVar1;
    if (0 < (int)uVar1) {
      uVar3 = uVar1;
    }
    uVar10 = (ulong)uVar3 % 0xe10;
    uVar1 = (uint)(ushort)uVar10;
    uVar2 = uVar1 % 0x3c;
    sVar12 = (short)uVar2;
    *(undefined2 *)(target + 1) =
         *(undefined2 *)
          (duckdb_fmt::v6::internal::basic_data<void>::digits + ((ulong)uVar3 / 0xe10) * 2);
    if (sVar12 != 0 || 0x3b < (uint)uVar10) {
      target[3] = ':';
      uVar1 = (uVar1 / 0x3c) * 2;
      target[4] = duckdb_fmt::v6::internal::basic_data<void>::digits[uVar1];
      target[5] = duckdb_fmt::v6::internal::basic_data<void>::digits[(ulong)(ushort)uVar1 + 1];
      if (sVar12 != 0) {
        target[6] = ':';
        uVar2 = uVar2 * 2;
        target[7] = duckdb_fmt::v6::internal::basic_data<void>::digits[uVar2];
        target[8] = duckdb_fmt::v6::internal::basic_data<void>::digits[(ulong)(ushort)uVar2 + 1];
        return target + 9;
      }
      return target + 6;
    }
    return target + 3;
  case 0x18:
    if (tz_name == (char *)0x0) {
      return target;
    }
    switchD_00916250::default(target,tz_name,tz_len);
    sVar7 = strlen(tz_name);
    return target + sVar7;
  default:
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_38,"Unimplemented specifier for WriteStandardSpecifier in strftime",
               &local_39);
    InternalException::InternalException(this_00,&local_38);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case 0x20:
    value = data[6];
    padding = 9;
LAB_0084c4f3:
    pcVar9 = WritePadded(this,target,value,padding);
    return pcVar9;
  }
  pcVar9 = Write2(this,target,value_00);
  return pcVar9;
}

Assistant:

char *StrfTimeFormat::WriteStandardSpecifier(StrTimeSpecifier specifier, int32_t data[], const char *tz_name,
                                             size_t tz_len, char *target) const {
	// data contains [0] year, [1] month, [2] day, [3] hour, [4] minute, [5] second, [6] ns, [7] utc (secs)
	switch (specifier) {
	case StrTimeSpecifier::DAY_OF_MONTH_PADDED:
		target = WritePadded2(target, UnsafeNumericCast<uint32_t>(data[2]));
		break;
	case StrTimeSpecifier::ABBREVIATED_MONTH_NAME: {
		auto &month_name = Date::MONTH_NAMES_ABBREVIATED[data[1] - 1];
		return WriteString(target, month_name);
	}
	case StrTimeSpecifier::FULL_MONTH_NAME: {
		auto &month_name = Date::MONTH_NAMES[data[1] - 1];
		return WriteString(target, month_name);
	}
	case StrTimeSpecifier::MONTH_DECIMAL_PADDED:
		target = WritePadded2(target, UnsafeNumericCast<uint32_t>(data[1]));
		break;
	case StrTimeSpecifier::YEAR_WITHOUT_CENTURY_PADDED:
		target = WritePadded2(target, UnsafeNumericCast<uint32_t>(AbsValue(data[0]) % 100));
		break;
	case StrTimeSpecifier::YEAR_DECIMAL:
		if (data[0] >= 0 && data[0] <= 9999) {
			target = WritePadded(target, UnsafeNumericCast<uint32_t>(data[0]), 4);
		} else {
			int32_t year = data[0];
			if (data[0] < 0) {
				*target = '-';
				year = -year;
				target++;
			}
			auto len = NumericHelper::UnsignedLength<uint32_t>(UnsafeNumericCast<uint32_t>(year));
			NumericHelper::FormatUnsigned(year, target + len);
			target += len;
		}
		break;
	case StrTimeSpecifier::HOUR_24_PADDED: {
		target = WritePadded2(target, UnsafeNumericCast<uint32_t>(data[3]));
		break;
	}
	case StrTimeSpecifier::HOUR_12_PADDED: {
		int hour = data[3] % 12;
		if (hour == 0) {
			hour = 12;
		}
		target = WritePadded2(target, UnsafeNumericCast<uint32_t>(hour));
		break;
	}
	case StrTimeSpecifier::AM_PM:
		*target++ = data[3] >= 12 ? 'P' : 'A';
		*target++ = 'M';
		break;
	case StrTimeSpecifier::MINUTE_PADDED: {
		target = WritePadded2(target, UnsafeNumericCast<uint32_t>(data[4]));
		break;
	}
	case StrTimeSpecifier::SECOND_PADDED:
		target = WritePadded2(target, UnsafeNumericCast<uint32_t>(data[5]));
		break;
	case StrTimeSpecifier::NANOSECOND_PADDED:
		target = WritePadded(target, UnsafeNumericCast<uint32_t>(data[6]), 9);
		break;
	case StrTimeSpecifier::MICROSECOND_PADDED:
		target = WritePadded(target, UnsafeNumericCast<uint32_t>(data[6] / Interval::NANOS_PER_MICRO), 6);
		break;
	case StrTimeSpecifier::MILLISECOND_PADDED:
		target = WritePadded3(target, UnsafeNumericCast<uint32_t>(data[6] / Interval::NANOS_PER_MSEC));
		break;
	case StrTimeSpecifier::UTC_OFFSET: {
		*target++ = (data[7] < 0) ? '-' : '+';

		auto offset = abs(data[7]);
		int hh, mm, ss;
		StrfTimeSplitOffset(offset, hh, mm, ss);
		target = WritePadded2(target, UnsafeNumericCast<uint32_t>(hh));
		if (mm || ss) {
			*target++ = ':';
			target = WritePadded2(target, UnsafeNumericCast<uint32_t>(mm));
		}
		if (ss) {
			*target++ = ':';
			target = WritePadded2(target, UnsafeNumericCast<uint32_t>(ss));
		}
		break;
	}
	case StrTimeSpecifier::TZ_NAME:
		if (tz_name) {
			memcpy(target, tz_name, tz_len);
			target += strlen(tz_name);
		}
		break;
	case StrTimeSpecifier::DAY_OF_MONTH: {
		target = Write2(target, UnsafeNumericCast<uint8_t>(data[2] % 100));
		break;
	}
	case StrTimeSpecifier::MONTH_DECIMAL: {
		target = Write2(target, UnsafeNumericCast<uint8_t>(data[1]));
		break;
	}
	case StrTimeSpecifier::YEAR_WITHOUT_CENTURY: {
		target = Write2(target, UnsafeNumericCast<uint8_t>(AbsValue(data[0]) % 100));
		break;
	}
	case StrTimeSpecifier::HOUR_24_DECIMAL: {
		target = Write2(target, UnsafeNumericCast<uint8_t>(data[3]));
		break;
	}
	case StrTimeSpecifier::HOUR_12_DECIMAL: {
		int hour = data[3] % 12;
		if (hour == 0) {
			hour = 12;
		}
		target = Write2(target, UnsafeNumericCast<uint8_t>(hour));
		break;
	}
	case StrTimeSpecifier::MINUTE_DECIMAL: {
		target = Write2(target, UnsafeNumericCast<uint8_t>(data[4]));
		break;
	}
	case StrTimeSpecifier::SECOND_DECIMAL: {
		target = Write2(target, UnsafeNumericCast<uint8_t>(data[5]));
		break;
	}
	default:
		throw InternalException("Unimplemented specifier for WriteStandardSpecifier in strftime");
	}
	return target;
}